

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  short *psVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  byte *pbVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  undefined4 in_register_00000014;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  short sVar22;
  ushort uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  nodeElt *huffNode0;
  undefined4 *__s;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  U16 nbPerRank [13];
  U16 valPerRank [13];
  undefined8 local_b0;
  uint local_a8 [2];
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_68;
  undefined8 local_60;
  unkbyte10 Stack_58;
  undefined6 local_4e;
  unkbyte10 Stack_48;
  
  local_b0 = CONCAT44(in_register_00000014,maxSymbolValue);
  uVar27 = (ulong)(-(int)workSpace & 3);
  __s = (undefined4 *)((long)workSpace + uVar27);
  puVar4 = (undefined4 *)(wkspSize - uVar27);
  if (wkspSize < uVar27) {
    __s = (undefined4 *)0x0;
    puVar4 = (undefined4 *)0x0;
  }
  sVar9 = 0xffffffffffffffbe;
  if (((undefined4 *)0x12ff < puVar4) && (sVar9 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    uVar19 = (ulong)(maxSymbolValue + 1);
    uVar21 = 0;
    memset(__s,0,0x1300);
    uVar27 = local_b0;
    do {
      uVar20 = count[uVar21];
      uVar29 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      uVar29 = (uVar29 ^ 0xffffffe0) + 0xbe;
      if (uVar20 < 0xa5) {
        uVar29 = uVar20;
      }
      *(short *)(__s + (ulong)uVar29 + 0x400) = *(short *)(__s + (ulong)uVar29 + 0x400) + 1;
      uVar21 = uVar21 + 1;
    } while (uVar19 != uVar21);
    lVar10 = 0x4be;
    do {
      sVar22 = *(short *)(__s + lVar10);
      *(short *)(__s + lVar10) = sVar22 + *(short *)(__s + lVar10 + 1);
      *(short *)((long)__s + lVar10 * 4 + 2) = sVar22 + *(short *)(__s + lVar10 + 1);
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0x3ff);
    uVar21 = 0;
    do {
      uVar20 = count[uVar21];
      uVar29 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      uVar29 = (uVar29 ^ 0xffffffe0) + 0xbe;
      if (uVar20 < 0xa5) {
        uVar29 = uVar20;
      }
      uVar23 = *(ushort *)((long)__s + (ulong)uVar29 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)uVar29 * 4 + 0x1006) = uVar23 + 1;
      __s[(ulong)uVar23 * 2 + 2] = uVar20;
      *(char *)((long)__s + (ulong)uVar23 * 8 + 0xe) = (char)uVar21;
      uVar21 = uVar21 + 1;
    } while (uVar19 != uVar21);
    lVar10 = 0x4a5;
    do {
      iVar16 = (uint)*(ushort *)((long)__s + lVar10 * 4 + 2) - (uint)*(ushort *)(__s + lVar10);
      if (1 < iVar16) {
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)*(ushort *)(__s + lVar10) * 2 + 2),0,
                            iVar16 + -1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x4bf);
    local_68 = uVar27 & 0xffffffff;
    lVar26 = (local_68 << 0x20) + 0x10000000000;
    lVar28 = (local_68 << 0x20) + 0x100000000;
    lVar10 = 0;
    do {
      lVar34 = lVar10 * 2;
      lVar10 = lVar10 + -1;
      lVar26 = lVar26 + -0x100000000;
      lVar28 = lVar28 + -0x100000000;
    } while (__s[local_68 * 2 + lVar34 + 2] == 0);
    uVar20 = 0xb;
    if (maxNbBits != 0) {
      uVar20 = maxNbBits;
    }
    __s[0x202] = __s[local_68 * 2 + lVar34 + 2] + __s[local_68 * 2 + lVar10 * 2 + 2];
    *(undefined2 *)(__s + local_68 * 2 + lVar10 * 2 + 3) = 0x100;
    *(undefined2 *)(__s + local_68 * 2 + lVar10 * 2 + 5) = 0x100;
    auVar7 = _DAT_003bd370;
    auVar6 = _DAT_003bd360;
    auVar5 = _DAT_003bd350;
    uVar21 = local_68 + 1 + lVar10;
    uVar31 = local_68 + lVar10 + 0x100;
    iVar16 = (int)uVar27;
    if ((long)uVar21 < 2) {
      *__s = 0x80000000;
    }
    else {
      uVar27 = (ulong)(iVar16 - 1) + lVar10;
      uVar33 = 0x101;
      if (0x101 < (int)uVar31) {
        uVar33 = uVar31 & 0xffffffff;
      }
      lVar34 = uVar33 - 0x101;
      auVar36._8_4_ = (int)lVar34;
      auVar36._0_8_ = lVar34;
      auVar36._12_4_ = (int)((ulong)lVar34 >> 0x20);
      uVar35 = 0;
      auVar36 = auVar36 ^ _DAT_003bd370;
      do {
        auVar37._8_4_ = (int)uVar35;
        auVar37._0_8_ = uVar35;
        auVar37._12_4_ = (int)(uVar35 >> 0x20);
        auVar38 = (auVar37 | auVar6) ^ auVar7;
        iVar25 = auVar36._4_4_;
        if ((bool)(~(auVar38._4_4_ == iVar25 && auVar36._0_4_ < auVar38._0_4_ ||
                    iVar25 < auVar38._4_4_) & 1)) {
          __s[uVar35 * 2 + 0x204] = 0x40000000;
        }
        if ((auVar38._12_4_ != auVar36._12_4_ || auVar38._8_4_ <= auVar36._8_4_) &&
            auVar38._12_4_ <= auVar36._12_4_) {
          __s[uVar35 * 2 + 0x206] = 0x40000000;
        }
        auVar37 = (auVar37 | auVar5) ^ auVar7;
        iVar24 = auVar37._4_4_;
        if (iVar24 <= iVar25 && (iVar24 != iVar25 || auVar37._0_4_ <= auVar36._0_4_)) {
          __s[uVar35 * 2 + 0x208] = 0x40000000;
          __s[uVar35 * 2 + 0x20a] = 0x40000000;
        }
        uVar35 = uVar35 + 4;
      } while ((uVar33 - 0xfd & 0xfffffffffffffffc) != uVar35);
      *__s = 0x80000000;
      if (1 < (long)uVar21) {
        uVar33 = 0x101;
        if (0x101 < (int)uVar31) {
          uVar33 = uVar31 & 0xffffffff;
        }
        local_60 = uVar33 - 0x100;
        iVar25 = 0x100;
        lVar34 = 0;
        do {
          iVar32 = (int)uVar27;
          uVar29 = __s[(long)iVar32 * 2 + 2];
          uVar30 = __s[(long)iVar25 * 2 + 2];
          iVar24 = (iVar25 + 1) - (uint)(uVar29 < uVar30);
          iVar8 = iVar25;
          if (uVar29 < uVar30) {
            iVar8 = iVar32;
          }
          uVar18 = (uint)(uVar29 < uVar30);
          iVar17 = iVar32 - uVar18;
          uVar29 = __s[(long)iVar17 * 2 + 2];
          uVar30 = __s[(long)iVar24 * 2 + 2];
          iVar25 = (iVar24 + 1) - (uint)(uVar29 < uVar30);
          uVar27 = (ulong)((iVar32 - uVar18) - (uint)(uVar29 < uVar30));
          if (uVar29 < uVar30) {
            iVar24 = iVar17;
          }
          __s[lVar34 * 2 + 0x204] = __s[(long)iVar24 * 2 + 2] + __s[(long)iVar8 * 2 + 2];
          sVar22 = (short)lVar34 + 0x101;
          *(short *)(__s + (long)iVar24 * 2 + 3) = sVar22;
          *(short *)(__s + (long)iVar8 * 2 + 3) = sVar22;
          lVar34 = lVar34 + 1;
        } while (uVar33 - 0x100 != lVar34);
      }
    }
    *(undefined1 *)((long)__s + (lVar26 >> 0x1d) + 0xf) = 0;
    if (1 < (long)uVar21) {
      pcVar11 = (char *)((long)__s + (ulong)(iVar16 + (int)lVar10 + 0xff) * 8 + 0xf);
      do {
        *pcVar11 = *(char *)((long)__s + (ulong)*(ushort *)(pcVar11 + -3) * 8 + 0xf) + '\x01';
        uVar29 = (int)uVar31 - 1;
        uVar31 = (ulong)uVar29;
        pcVar11 = pcVar11 + -8;
      } while (0x100 < (int)uVar29);
    }
    uVar27 = local_68 + lVar10 + 2;
    if (-1 < (long)uVar21) {
      uVar31 = 0;
      do {
        *(char *)((long)__s + uVar31 * 8 + 0xf) =
             *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar31 * 2 + 3) * 8 + 0xf) + '\x01';
        uVar31 = uVar31 + 1;
      } while ((uVar27 & 0xffffffff) != uVar31);
    }
    bVar2 = *(byte *)((long)__s + (uVar21 & 0xffffffff) * 8 + 0xf);
    iVar16 = bVar2 - uVar20;
    uVar29 = (uint)bVar2;
    if (uVar20 <= bVar2 && iVar16 != 0) {
      bVar13 = (byte)iVar16;
      bVar3 = *(byte *)((long)__s + (lVar28 >> 0x1d) + 0xf);
      iVar16 = 0;
      uVar31 = uVar21;
      if (uVar20 < bVar3) {
        uVar31 = lVar28 >> 0x20;
        iVar16 = 0;
        do {
          iVar16 = (-1 << (bVar2 - bVar3 & 0x1f)) + iVar16 + (1 << (bVar13 & 0x1f));
          *(char *)((long)__s + uVar31 * 8 + 0xf) = (char)uVar20;
          bVar3 = *(byte *)((long)__s + uVar31 * 8 + 7);
          uVar31 = uVar31 - 1;
        } while (uVar20 < bVar3);
      }
      uVar31 = (long)(int)uVar31 + 1;
      do {
        lVar10 = uVar31 * 8;
        uVar31 = uVar31 - 1;
      } while (uVar20 == *(byte *)((long)__s + lVar10 + 7));
      uVar30 = iVar16 >> (bVar13 & 0x1f);
      local_78 = 0xf0f0f0f0f0f0f0f0;
      local_88 = 0xf0f0f0f0f0f0f0f0;
      uStack_80 = 0xf0f0f0f0f0f0f0f0;
      local_98 = 0xf0f0f0f0f0f0f0f0;
      uStack_90 = 0xf0f0;
      uStack_8e = 0xf0f0f0f0f0f0;
      local_a8[0] = 0xf0f0f0f0;
      local_a8[1] = -0xf0f0f10;
      uStack_a0 = 0xf0f0;
      uStack_9e = 0xf0f0f0f0f0f0;
      if (-1 < (long)uVar31) {
        pbVar12 = (byte *)((long)__s + (uVar31 & 0xffffffff) * 8 + 0xf);
        uVar33 = uVar31 & 0xffffffff;
        uVar29 = uVar20;
        do {
          uVar18 = (uint)uVar33;
          if (*pbVar12 < uVar29) {
            uVar29 = (uint)*pbVar12;
            local_a8[uVar20 - uVar29] = uVar18;
          }
          pbVar12 = pbVar12 + -8;
          uVar33 = (ulong)(uVar18 - 1);
        } while (0 < (int)uVar18);
      }
      for (; 0 < (int)uVar30; uVar30 = (-1 << ((byte)uVar14 & 0x1f)) + uVar30) {
        uVar29 = 0x1f;
        if (uVar30 != 0) {
          for (; uVar30 >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        uVar35 = (ulong)(0x20 - (uVar29 ^ 0x1f));
        uVar33 = uVar35;
        if ((uVar29 ^ 0x1f) != 0x1f) {
          do {
            uVar15 = uVar33 - 1;
            if (((ulong)local_a8[uVar33] != 0xf0f0f0f0) &&
               ((local_a8[uVar15 & 0xffffffff] == 0xf0f0f0f0 ||
                ((uint)__s[(ulong)local_a8[uVar33] * 2 + 2] <=
                 (uint)(__s[(ulong)local_a8[uVar15 & 0xffffffff] * 2 + 2] * 2)))))
            goto LAB_00381b1f;
            uVar35 = (ulong)((int)uVar35 - 1);
            uVar33 = uVar15;
          } while ((uVar15 & 0xfffffffe) != 0);
          uVar35 = 1;
        }
LAB_00381b1f:
        if ((uint)uVar35 < 0xd) {
          do {
            if (local_a8[uVar35] != 0xf0f0f0f0) goto LAB_00381b42;
            uVar35 = uVar35 + 1;
          } while (uVar35 != 0xd);
          uVar35 = 0xd;
        }
LAB_00381b42:
        uVar14 = (int)uVar35 - 1;
        uVar33 = uVar35 & 0xffffffff;
        uVar29 = local_a8[uVar33];
        pcVar11 = (char *)((long)__s + (ulong)uVar29 * 8 + 0xf);
        *pcVar11 = *pcVar11 + '\x01';
        uVar18 = local_a8[uVar14];
        if (local_a8[uVar14] == 0xf0f0f0f0) {
          uVar18 = uVar29;
        }
        local_a8[uVar14] = uVar18;
        if ((ulong)uVar29 == 0) {
          uVar29 = 0xf0f0f0f0;
        }
        else {
          uVar29 = uVar29 - 1;
          local_a8[uVar33] = uVar29;
          if (uVar20 - (int)uVar35 != (uint)*(byte *)((long)__s + (ulong)uVar29 * 8 + 0xf)) {
            uVar29 = 0xf0f0f0f0;
          }
        }
        local_a8[uVar33] = uVar29;
      }
      uVar29 = uVar20;
      if ((int)uVar30 < 0) {
        do {
          uVar18 = 0xffffffff;
          if (-1 < (int)uVar30) {
            uVar18 = uVar30;
          }
          iVar16 = 0;
          while (local_a8[1] + iVar16 != -0xf0f0f10) {
            pcVar11 = (char *)((long)__s + (ulong)(iVar16 + local_a8[1] + 1) * 8 + 0xf);
            *pcVar11 = *pcVar11 + -1;
            iVar16 = iVar16 + 1;
            if (~uVar18 + uVar30 + iVar16 == 0) goto LAB_00381c31;
          }
          iVar24 = (int)uVar31;
          iVar25 = uVar30 + iVar16;
          uVar31 = (long)iVar24 + 1;
          local_a8[1] = iVar24 + 2;
          do {
            lVar10 = uVar31 * 8;
            uVar31 = uVar31 - 1;
            local_a8[1] = local_a8[1] + -1;
          } while (uVar20 == *(byte *)((long)__s + lVar10 + 7));
          pcVar11 = (char *)((long)__s + (long)(int)local_a8[1] * 8 + 0xf);
          *pcVar11 = *pcVar11 + -1;
          uVar30 = uVar30 + iVar16 + 1;
        } while (iVar25 < -1);
      }
    }
LAB_00381c31:
    sVar9 = 0xffffffffffffffff;
    if (uVar29 < 0xd) {
      local_98 = 0;
      uStack_90 = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      uStack_a0 = 0;
      uStack_9e = 0;
      Stack_48 = SUB1610((undefined1  [16])0x0,6);
      Stack_58 = SUB1610((undefined1  [16])0x0,0);
      local_4e = 0;
      if (-1 < (long)uVar21) {
        uVar21 = 0;
        do {
          psVar1 = (short *)((long)local_a8 + (ulong)*(byte *)((long)__s + uVar21 * 8 + 0xf) * 2);
          *psVar1 = *psVar1 + 1;
          uVar21 = uVar21 + 1;
        } while ((uVar27 & 0xffffffff) != uVar21);
      }
      sVar9 = (size_t)uVar29;
      if (uVar29 != 0) {
        lVar10 = sVar9 + 1;
        uVar23 = 0;
        do {
          *(ushort *)((long)&local_60 + lVar10 * 2 + 6) = uVar23;
          uVar23 = (ushort)(uVar23 + *(short *)((long)&local_b0 + lVar10 * 2 + 6)) >> 1;
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
      }
      uVar27 = 0;
      do {
        CTable[(ulong)*(byte *)((long)__s + uVar27 * 8 + 0xe) + 1] =
             (ulong)*(byte *)((long)__s + uVar27 * 8 + 0xf);
        uVar27 = uVar27 + 1;
      } while (uVar19 != uVar27);
      uVar27 = 0;
      do {
        uVar21 = CTable[uVar27 + 1];
        uVar31 = uVar21 & 0xff;
        uVar23 = *(ushort *)((long)&Stack_58 + uVar31 * 2);
        *(ushort *)((long)&Stack_58 + uVar31 * 2) = uVar23 + 1;
        if (uVar31 != 0) {
          CTable[uVar27 + 1] = (ulong)uVar23 << (-(char)uVar21 & 0x3fU) | uVar21;
        }
        uVar27 = uVar27 + 1;
      } while (uVar19 != uVar27);
      *(char *)CTable = (char)uVar29;
      *(char *)((long)CTable + 1) = (char)local_b0;
      *(undefined4 *)((long)CTable + 2) = 0;
      *(undefined2 *)((long)CTable + 6) = 0;
    }
  }
  return sVar9;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}